

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::ExpParameter::InternalSerializeWithCachedSizesToArray
          (ExpParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  UnknownFieldSet *unknown_fields;
  float fVar2;
  uint8 *puStack_40;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  ExpParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  puStack_40 = target;
  if ((uVar1 & 2) != 0) {
    fVar2 = base(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(1,fVar2,target);
  }
  if ((uVar1 & 4) != 0) {
    fVar2 = scale(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(2,fVar2,puStack_40);
  }
  if ((uVar1 & 1) != 0) {
    fVar2 = shift(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(3,fVar2,puStack_40);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = ExpParameter::unknown_fields(this);
    puStack_40 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                           (unknown_fields,puStack_40);
  }
  return puStack_40;
}

Assistant:

::google::protobuf::uint8* ExpParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.ExpParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional float base = 1 [default = -1];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(1, this->base(), target);
  }

  // optional float scale = 2 [default = 1];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(2, this->scale(), target);
  }

  // optional float shift = 3 [default = 0];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(3, this->shift(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.ExpParameter)
  return target;
}